

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_scalar_functions.hpp
# Opt level: O3

void check_text(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  uint uVar1;
  void *__s;
  AssertionHandler catchAssertionHandler;
  undefined4 local_d0;
  int local_cc;
  SourceLineInfo local_c8;
  ITransientExpression local_b8;
  int *local_a8;
  char *local_a0;
  size_t sStack_98;
  undefined4 *local_90;
  AssertionHandler local_88;
  StringRef local_40;
  
  local_b8._vptr_ITransientExpression = (_func_int **)0x182431;
  local_b8.m_isBinaryExpression = true;
  local_b8.m_result = false;
  local_b8._10_6_ = 0;
  local_c8.file =
       "/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/tools/sqlite3_api_wrapper/test/include/udf_scalar_functions.hpp"
  ;
  local_c8.line = 0x34;
  local_cc = argc;
  Catch::StringRef::StringRef(&local_40,"argc == 1");
  Catch::AssertionHandler::AssertionHandler
            (&local_88,(StringRef *)&local_b8,&local_c8,local_40,Normal);
  local_d0 = 1;
  Catch::StringRef::StringRef((StringRef *)&local_c8,"==");
  local_b8.m_result = argc == 1;
  local_b8.m_isBinaryExpression = true;
  local_b8._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001b2c68;
  local_a0 = local_c8.file;
  sStack_98 = local_c8.line;
  local_a8 = &local_cc;
  local_90 = &local_d0;
  Catch::AssertionHandler::handleExpr(&local_88,&local_b8);
  Catch::ITransientExpression::~ITransientExpression(&local_b8);
  Catch::AssertionHandler::complete(&local_88);
  if (local_88.m_completed == false) {
    (*(local_88.m_resultCapture)->_vptr_IResultCapture[0x11])();
  }
  __s = (void *)duckdb_shell_sqlite3_value_text(*argv);
  uVar1 = duckdb_shell_sqlite3_value_bytes(*argv);
  if (0 < (int)uVar1) {
    memset(__s,0x54,(ulong)uVar1);
  }
  duckdb_shell_sqlite3_result_text(context,__s,(ulong)uVar1,0);
  return;
}

Assistant:

static void check_text(sqlite3_context *context, int argc, sqlite3_value **argv) {
	REQUIRE(argc == 1);
	char *str = (char *)sqlite3_value_text(argv[0]);
	int len = sqlite3_value_bytes(argv[0]);
	for (int i = 0; i < len; ++i) {
		str[i] = 'T';
	}
	sqlite3_result_text(context, str, len, nullptr);
}